

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOptimizedPixelReading.h
# Opt level: O0

void Imf_2_5::optimizedWriteToRGBA
               (unsigned_short **readPtrRed,unsigned_short **readPtrGreen,
               unsigned_short **readPtrBlue,unsigned_short **readPtrAlpha,unsigned_short **writePtr,
               size_t *pixelsToCopySSE,size_t *pixelsToCopyNormal)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  unsigned_short **in_RCX;
  unsigned_short **in_RDX;
  unsigned_short **in_RSI;
  unsigned_short **in_RDI;
  unsigned_short **in_R8;
  bool writePtrIsAligned;
  bool readPtrAreAligned;
  size_t *in_stack_00000050;
  __m128i **in_stack_00000058;
  __m128i **in_stack_00000060;
  __m128i **in_stack_00000068;
  __m128i **in_stack_00000070;
  __m128i **in_stack_00000078;
  
  bVar2 = isPointerSSEAligned(*in_RDI);
  bVar3 = isPointerSSEAligned(*in_RSI);
  bVar4 = isPointerSSEAligned(*in_RDX);
  bVar5 = isPointerSSEAligned(*in_RCX);
  bVar1 = ((bVar2 && bVar3) && bVar4) && bVar5;
  bVar6 = isPointerSSEAligned(*in_R8);
  if ((bVar1) || (bVar6)) {
    if ((bVar1) || (!bVar6)) {
      if ((((!bVar2 || !bVar3) || !bVar4) || !bVar5) || (bVar6)) {
        if ((((bVar2 && bVar3) && bVar4) && bVar5) && (bVar6)) {
          writeToRGBASSETemplate<true,true>
                    (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                     in_stack_00000058,in_stack_00000050);
        }
      }
      else {
        writeToRGBASSETemplate<true,false>
                  (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                   in_stack_00000058,in_stack_00000050);
      }
    }
    else {
      writeToRGBASSETemplate<false,true>
                (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                 in_stack_00000058,in_stack_00000050);
    }
  }
  else {
    writeToRGBASSETemplate<false,false>
              (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
               in_stack_00000058,in_stack_00000050);
  }
  writeToRGBANormal(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,pixelsToCopySSE);
  return;
}

Assistant:

EXR_FORCEINLINE 
void optimizedWriteToRGBA (unsigned short*& readPtrRed,
                           unsigned short*& readPtrGreen,
                           unsigned short*& readPtrBlue,
                           unsigned short*& readPtrAlpha,
                           unsigned short*& writePtr,
                           const size_t& pixelsToCopySSE,
                           const size_t& pixelsToCopyNormal)
{
    bool readPtrAreAligned = true;

    readPtrAreAligned &= isPointerSSEAligned(readPtrRed);
    readPtrAreAligned &= isPointerSSEAligned(readPtrGreen);
    readPtrAreAligned &= isPointerSSEAligned(readPtrBlue);
    readPtrAreAligned &= isPointerSSEAligned(readPtrAlpha);

    bool writePtrIsAligned = isPointerSSEAligned(writePtr);

    if (!readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBASSETemplate<false, false> ((__m128i*&)readPtrRed,
                                              (__m128i*&)readPtrGreen,
                                              (__m128i*&)readPtrBlue,
                                              (__m128i*&)readPtrAlpha,
                                              (__m128i*&)writePtr,
                                              pixelsToCopySSE);
    }
    else if (!readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBASSETemplate<false, true> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)readPtrAlpha,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if (readPtrAreAligned && !writePtrIsAligned)
    {
        writeToRGBASSETemplate<true, false> ((__m128i*&)readPtrRed,
                                             (__m128i*&)readPtrGreen,
                                             (__m128i*&)readPtrBlue,
                                             (__m128i*&)readPtrAlpha,
                                             (__m128i*&)writePtr,
                                             pixelsToCopySSE);
    }
    else if(readPtrAreAligned && writePtrIsAligned)
    {
        writeToRGBASSETemplate<true, true> ((__m128i*&)readPtrRed,
                                            (__m128i*&)readPtrGreen,
                                            (__m128i*&)readPtrBlue,
                                            (__m128i*&)readPtrAlpha,
                                            (__m128i*&)writePtr,
                                            pixelsToCopySSE);
    }

    writeToRGBANormal (readPtrRed, readPtrGreen, readPtrBlue, readPtrAlpha,
                       writePtr, pixelsToCopyNormal);
}